

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_38;
  size_t our_size;
  int number_local;
  Extension *this_local;
  
  if ((this->type == '\v') && ((this->is_repeated & 1U) == 0)) {
    if (((byte)this->field_0xa >> 1 & 1) == 0) {
      sVar1 = io::CodedOutputStream::VarintSize32(number);
      if (((byte)this->field_0xa >> 2 & 1) == 0) {
        local_38 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        local_38 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      sVar2 = WireFormatLite::LengthDelimitedSize(local_38);
      this_local = (Extension *)(sVar2 + sVar1 + 4);
    }
    else {
      this_local = (Extension *)0x0;
    }
  }
  else {
    this_local = (Extension *)ByteSize(this,number);
  }
  return (size_t)this_local;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  our_size += WireFormatLite::LengthDelimitedSize(
      is_lazy ? ptr.lazymessage_value->ByteSizeLong()
              : ptr.message_value->ByteSizeLong());

  return our_size;
}